

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O3

ulint __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,symbol x,
          ulint i)

{
  pointer pvVar1;
  subtree_const_ref t;
  size_t sVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  reference rVar7;
  vector<bool,_std::allocator<bool>_> local_80;
  __uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  local_58;
  undefined8 uStack_50;
  size_t sStack_48;
  size_t sStack_40;
  size_t sStack_38;
  
  if (this->n == 0) {
    i = 0;
  }
  else if (this->unary_string == false) {
    pvVar1 = (this->codes).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (ulong)x;
    uVar4 = ((long)(this->codes).
                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            -0x3333333333333333;
    if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    std::vector<bool,_std::allocator<bool>_>::vector(&local_80,pvVar1 + uVar5);
    uVar6 = 1;
    uVar4 = 0;
    while( true ) {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::at(&local_80,(ulong)(uVar6 - 1));
      uVar5 = rVar7._M_mask & *rVar7._M_p;
      local_58._M_t.
      super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
      .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
      _M_head_impl = (this->wavelet_tree).
                     super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4]._impl._M_t.
                     super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                     ._M_t;
      sStack_48 = *(size_t *)
                   ((long)local_58._M_t.
                          super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                          .
                          super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                          ._M_head_impl + 0x50);
      uStack_50 = 0;
      sStack_40 = *(size_t *)
                   ((long)local_58._M_t.
                          super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                          .
                          super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                          ._M_head_impl + 0x40);
      sStack_38 = *(size_t *)
                   ((long)local_58._M_t.
                          super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                          .
                          super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                          ._M_head_impl + 0x48);
      t._index = 0;
      t._vector = (bt_impl_t *)
                  local_58._M_t.
                  super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                  .
                  super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                  ._M_head_impl;
      t._height = sStack_48;
      t._size = sStack_40;
      t._rank = sStack_38;
      sVar2 = bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::getrank
                        ((bt_impl<4096UL,_(bv::allocation_policy_t)0> *)
                         local_58._M_t.
                         super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                         .
                         super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                         ._M_head_impl,t,i,0);
      i = i - sVar2;
      if (uVar5 != 0) {
        i = sVar2;
      }
      if ((ulong)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p) * 8 == (ulong)uVar6) break;
      pvVar3 = &this->child1;
      if (uVar5 == 0) {
        pvVar3 = &this->child0;
      }
      uVar6 = uVar6 + 1;
      uVar4 = (ulong)(pvVar3->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar4];
    }
    if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return i;
}

Assistant:

ulint rank(symbol x, ulint i){

		if(n==0)
			return 0;

	#ifdef DEBUG
		if(i>current_size){

			cout << "ERROR (DynamicString): trying to compute rank in position outside current string : " << i << ">" << current_size << endl;
			exit(0);

		}
	#endif

		if(unary_string)
			return i;

		vector<bool> code = codes.at(x);//bitvector to be searched in the wavelet tree
		return rank(&code, 0, 0, i);

	}